

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  char cVar1;
  connectdata *conn;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  unsigned_short uVar4;
  int iVar5;
  resolve_t rVar6;
  CURLcode CVar7;
  if2ip_result_t iVar8;
  ulong uVar9;
  char *pcVar10;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  long lVar15;
  ushort uVar16;
  uint uVar17;
  ftpport fVar18;
  char cVar19;
  bool bVar20;
  uint uVar21;
  Curl_addrinfo *ai;
  bool bVar22;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *dns_entry;
  char myhost [47];
  Curl_sockaddr_storage ss;
  char target [67];
  char ipstr [50];
  char buffer [256];
  char hbuf [1025];
  curl_socket_t local_6a8;
  socklen_t local_6a4;
  char *local_6a0;
  char *local_698;
  Curl_dns_entry *local_690;
  ftpport local_684;
  pingpong *local_680;
  char local_678 [48];
  sockaddr local_648 [8];
  char local_5c8 [80];
  char local_578 [64];
  char local_538 [256];
  char local_438 [1032];
  
  conn = data->conn;
  local_6a8 = -1;
  local_678[0x20] = '\0';
  local_678[0x21] = '\0';
  local_678[0x22] = '\0';
  local_678[0x23] = '\0';
  local_678[0x24] = '\0';
  local_678[0x25] = '\0';
  local_678[0x26] = '\0';
  local_678[0x27] = '\0';
  local_678[0x28] = '\0';
  local_678[0x29] = '\0';
  local_678[0x2a] = '\0';
  local_678[0x2b] = '\0';
  local_678[0x2c] = '\0';
  local_678[0x2d] = '\0';
  local_678[0x2e] = '\0';
  local_678[0x10] = '\0';
  local_678[0x11] = '\0';
  local_678[0x12] = '\0';
  local_678[0x13] = '\0';
  local_678[0x14] = '\0';
  local_678[0x15] = '\0';
  local_678[0x16] = '\0';
  local_678[0x17] = '\0';
  local_678[0x18] = '\0';
  local_678[0x19] = '\0';
  local_678[0x1a] = '\0';
  local_678[0x1b] = '\0';
  local_678[0x1c] = '\0';
  local_678[0x1d] = '\0';
  local_678[0x1e] = '\0';
  local_678[0x1f] = 0;
  local_678[0] = '\0';
  local_678[1] = '\0';
  local_678[2] = '\0';
  local_678[3] = '\0';
  local_678[4] = '\0';
  local_678[5] = '\0';
  local_678[6] = '\0';
  local_678[7] = '\0';
  local_678[8] = '\0';
  local_678[9] = '\0';
  local_678[10] = '\0';
  local_678[0xb] = '\0';
  local_678[0xc] = '\0';
  local_678[0xd] = '\0';
  local_678[0xe] = '\0';
  local_678[0xf] = '\0';
  pcVar10 = (data->set).str[0x24];
  local_690 = (Curl_dns_entry *)0x0;
  local_684 = fcmd;
  if ((pcVar10 == (char *)0x0) || (uVar9 = strlen(pcVar10), uVar9 < 2)) {
    pcVar13 = (char *)0x0;
    pcVar10 = (char *)0x0;
    local_6a0 = (char *)0x0;
  }
  else {
    if (*pcVar10 == ':') {
      uVar9 = 0;
      local_6a0 = (char *)0x0;
    }
    else if (*pcVar10 == '[') {
      local_6a0 = pcVar10 + 1;
      pcVar10 = strchr(local_6a0,0x5d);
      uVar9 = (long)pcVar10 - (long)local_6a0;
      if (pcVar10 == (char *)0x0) {
        uVar9 = 0;
        local_6a0 = (char *)0x0;
      }
    }
    else {
      pcVar13 = strchr(pcVar10,0x3a);
      local_6a0 = pcVar10;
      if (pcVar13 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        uVar9 = (long)pcVar13 - (long)pcVar10;
        iVar5 = inet_pton(10,pcVar10,local_648[0].sa_data + 6);
        pcVar10 = (char *)0x0;
        if (iVar5 != 1) {
          pcVar10 = pcVar13;
        }
      }
    }
    pcVar13 = (char *)0x0;
    if (pcVar10 == (char *)0x0) {
      uVar21 = 0;
      uVar17 = 0;
    }
    else {
      pcVar10 = strchr(pcVar10,0x3a);
      if (pcVar10 == (char *)0x0) {
        uVar21 = 0;
        uVar17 = 0;
      }
      else {
        uVar14 = strtoul(pcVar10 + 1,(char **)0x0,10);
        uVar4 = curlx_ultous(uVar14);
        uVar21 = (uint)CONCAT62(extraout_var,uVar4);
        pcVar10 = strchr(pcVar10,0x2d);
        uVar17 = uVar21;
        if (pcVar10 != (char *)0x0) {
          uVar14 = strtoul(pcVar10 + 1,(char **)0x0,10);
          uVar4 = curlx_ultous(uVar14);
          uVar17 = (uint)CONCAT62(extraout_var_00,uVar4);
        }
      }
    }
    pcVar10 = (char *)(ulong)uVar21;
    if ((ushort)uVar17 < (ushort)uVar21) {
      pcVar10 = pcVar13;
    }
    pcVar12 = (char *)(ulong)uVar17;
    if ((ushort)uVar17 < (ushort)uVar21) {
      pcVar12 = pcVar13;
    }
    bVar22 = true;
    if (uVar9 != 0) {
      if (uVar9 < 0x32) {
        pcVar13 = local_6a0;
        local_6a0 = pcVar12;
        local_698 = pcVar10;
        memcpy(local_578,pcVar13,uVar9);
        local_578[uVar9] = '\0';
        iVar5 = conn->remote_addr->family;
        uVar17 = Curl_ipv6_scope(&(conn->remote_addr->_sa_ex_u).addr);
        pcVar13 = local_438;
        iVar8 = Curl_if2ip(iVar5,uVar17,conn->scope_id,local_578,pcVar13,0x401);
        pcVar10 = local_698;
        pcVar12 = local_6a0;
        if (iVar8 != IF2IP_FOUND) {
          if (iVar8 == IF2IP_AF_NOT_SUPPORTED) goto LAB_0012cda2;
          pcVar13 = local_578;
          if (iVar8 != IF2IP_NOT_FOUND) {
            pcVar13 = (char *)0x0;
          }
        }
      }
      else {
LAB_0012cda2:
        local_6a0 = pcVar12;
        bVar22 = false;
        pcVar13 = (char *)0x0;
        pcVar12 = local_6a0;
      }
    }
    local_6a0 = pcVar12;
    CVar7 = CURLE_FTP_PORT_FAILED;
    if (!bVar22) goto LAB_0012ce8a;
  }
  bVar22 = true;
  if (pcVar13 == (char *)0x0) {
    local_6a4 = 0x80;
    iVar5 = getsockname(conn->sock[0],local_648,&local_6a4);
    if (iVar5 == 0) {
      pcVar13 = local_438;
      pcVar12 = inet_ntop((uint)local_648[0].sa_family,
                          local_648[0].sa_data + (ulong)(local_648[0].sa_family == 10) * 4 + 2,
                          pcVar13,0x401);
      bVar22 = pcVar12 == (char *)0x0;
      bVar20 = !bVar22;
      if (bVar22) {
        pcVar13 = (char *)0x0;
      }
    }
    else {
      piVar11 = __errno_location();
      pcVar12 = Curl_strerror(*piVar11,local_538,0x100);
      pcVar13 = (char *)0x0;
      Curl_failf(data,"getsockname() failed: %s",pcVar12);
      bVar22 = true;
      bVar20 = false;
    }
    CVar7 = CURLE_FTP_PORT_FAILED;
    if (!bVar20) goto LAB_0012ce8a;
  }
  rVar6 = Curl_resolv(data,pcVar13,0,false,&local_690);
  if (rVar6 == CURLRESOLV_PENDING) {
    Curl_resolver_wait_resolv(data,&local_690);
  }
  if (local_690 == (Curl_dns_entry *)0x0) {
    ai = (Curl_addrinfo *)0x0;
  }
  else {
    ai = local_690->addr;
  }
  if (ai == (Curl_addrinfo *)0x0) {
    pcVar10 = "failed to resolve the address provided to PORT: %s";
  }
  else {
    local_698 = pcVar10;
    while (CVar7 = Curl_socket_open(data,ai,(Curl_sockaddr_ex *)0x0,(uint)conn->transport,&local_6a8
                                   ), pcVar10 = local_698, CVar7 != CURLE_OK) {
      ai = ai->ai_next;
      if (ai == (Curl_addrinfo *)0x0) goto LAB_0012cc0e;
    }
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar13 = "???";
      }
      else {
        pcVar13 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] ftp_state_use_port(), opened socket",pcVar13);
    }
    local_680 = (pingpong *)&conn->proto;
    memcpy(local_648,ai->ai_addr,(ulong)ai->ai_addrlen);
    local_6a4 = ai->ai_addrlen;
    if ((ushort)local_6a0 < (ushort)pcVar10) goto LAB_0012ce73;
    do {
      bVar20 = false;
      uVar9 = (ulong)local_698 & 0xffffffff;
      while( true ) {
        local_648[0].sa_data._0_2_ = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
        iVar5 = bind(local_6a8,local_648,local_6a4);
        if (iVar5 == 0) {
          if (bVar20) goto LAB_0012ce73;
          local_6a4 = 0x80;
          iVar5 = getsockname(local_6a8,local_648,&local_6a4);
          if (iVar5 != 0) {
            piVar11 = __errno_location();
            iVar5 = *piVar11;
            goto LAB_0012cfea;
          }
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_ftp.log_level)))) {
            if (data->conn == (connectdata *)0x0) {
              pcVar10 = "???";
            }
            else {
              pcVar10 = ftp_state_names[(data->conn->proto).ftpc.state];
            }
            Curl_trc_ftp(data,"[%s] ftp_state_use_port(), socket bound to port %d",pcVar10,
                         uVar9 & 0xffff);
          }
          iVar5 = listen(local_6a8,1);
          if (iVar5 != 0) goto LAB_0012cc0e;
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
            if (data->conn == (connectdata *)0x0) {
              pcVar10 = "???";
            }
            else {
              pcVar10 = ftp_state_names[(data->conn->proto).ftpc.state];
            }
            Curl_trc_ftp(data,"[%s] ftp_state_use_port(), listening on %d",pcVar10,uVar9 & 0xffff);
          }
          Curl_printable_address(ai,local_678,0x2f);
          if ((SUB84(conn->bits,0) & 0x10800) == 0x800) {
            conn->bits = (ConnectBits)((ulong)conn->bits | 0x10000);
          }
          CVar7 = Curl_conn_tcp_listen_set(data,conn,1,&local_6a8);
          if (CVar7 != CURLE_OK) goto LAB_0012ce8a;
          local_6a8 = -1;
          fVar18 = local_684;
          CVar3 = CURLE_OK;
          if (local_684 == DONE) goto LAB_0012d1e8;
          goto LAB_0012d1a4;
        }
        piVar11 = __errno_location();
        iVar5 = *piVar11;
        if ((bool)(iVar5 == 99 & bVar22)) break;
        if ((iVar5 != 0xd) && (iVar5 != 0x62)) {
          pcVar10 = Curl_strerror(iVar5,local_538,0x100);
          Curl_failf(data,"bind(port=%hu) failed: %s",uVar9 & 0xffff,pcVar10);
          goto LAB_0012ce84;
        }
        uVar17 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar17;
        uVar16 = (ushort)uVar17;
        bVar20 = (ushort)local_6a0 < uVar16;
        if ((ushort)local_6a0 < uVar16) goto LAB_0012ce73;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        pcVar10 = Curl_strerror(99,local_538,0x100);
        Curl_infof(data,"bind(port=%hu) on non-local address failed: %s",uVar9 & 0xffff,pcVar10);
      }
      local_6a4 = 0x80;
      iVar5 = getsockname(conn->sock[0],local_648,&local_6a4);
      bVar22 = false;
    } while (iVar5 == 0);
    iVar5 = *piVar11;
LAB_0012cfea:
    pcVar13 = Curl_strerror(iVar5,local_538,0x100);
    pcVar10 = "getsockname() failed: %s";
  }
LAB_0012cc43:
  Curl_failf(data,pcVar10,pcVar13);
LAB_0012ce84:
  CVar7 = CURLE_FTP_PORT_FAILED;
LAB_0012ce8a:
  if (local_690 != (Curl_dns_entry *)0x0) {
    Curl_resolv_unlink(data,&local_690);
  }
  if (CVar7 != CURLE_OK) {
    _ftp_state(data,'\0');
  }
  if (local_6a8 != -1) {
    Curl_socket_close(data,conn,local_6a8);
  }
  return CVar7;
LAB_0012cc0e:
  piVar11 = __errno_location();
  pcVar13 = Curl_strerror(*piVar11,local_538,0x100);
  pcVar10 = "socket failure: %s";
  goto LAB_0012cc43;
LAB_0012d1a4:
  if ((((fVar18 == EPRT) && (((ulong)conn->bits & 0x10000) == 0)) ||
      (fVar18 == PORT && local_648[0].sa_family != 2)) ||
     ((local_648[0].sa_family != 2 && (local_648[0].sa_family != 10)))) goto LAB_0012d1dc;
  if (fVar18 != EPRT) {
    if (fVar18 != PORT) goto LAB_0012d1dc;
    lVar15 = 0;
    while( true ) {
      cVar1 = local_678[lVar15];
      cVar19 = ',';
      if ((cVar1 != '.') && (cVar19 = cVar1, cVar1 == '\0')) break;
      local_5c8[lVar15] = cVar19;
      lVar15 = lVar15 + 1;
    }
    local_5c8[lVar15] = '\0';
    curl_msnprintf(local_5c8 + lVar15,0x14,",%d,%d",(ulong)(local_648[0].sa_data._0_2_ & 0xff),
                   (ulong)SUB21(local_648[0].sa_data._0_2_,1));
    CVar7 = Curl_pp_sendf(data,local_680,"%s %s",0x177f59,local_5c8);
    CVar3 = CVar7;
    if (CVar7 != CURLE_OK) {
      pcVar10 = curl_easy_strerror(CVar7);
      Curl_failf(data,"Failure sending PORT command: %s",pcVar10);
      goto LAB_0012ce8a;
    }
    goto LAB_0012d1e8;
  }
  CVar7 = Curl_pp_sendf(data,local_680,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                        (ulong)((local_648[0].sa_family != 2) + 1),local_678,
                        (uint)(ushort)(local_648[0].sa_data._0_2_ << 8 |
                                      (ushort)local_648[0].sa_data._0_2_ >> 8));
  CVar3 = CURLE_OK;
  if (CVar7 == CURLE_OK) goto LAB_0012d1e8;
  pcVar10 = curl_easy_strerror(CVar7);
  Curl_failf(data,"Failure sending EPRT command: %s",pcVar10);
  goto LAB_0012ce8a;
LAB_0012d1dc:
  fVar18 = fVar18 + PORT;
  if (fVar18 == DONE) goto code_r0x0012d1e3;
  goto LAB_0012d1a4;
code_r0x0012d1e3:
  fVar18 = DONE;
  CVar3 = CURLE_OK;
LAB_0012d1e8:
  CVar7 = CVar3;
  (conn->proto).ftpc.count1 = fVar18;
  _ftp_state(data,'\x1c');
  goto LAB_0012ce8a;
LAB_0012ce73:
  Curl_failf(data,"bind() failed, we ran out of ports");
  goto LAB_0012ce84;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_FTP_PORT_FAILED;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef USE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *dns_entry = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;
  size_t addrlen = 0;
  char ipstr[50];

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {
    char *ip_end = NULL;

#ifdef USE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      char *ip_start = string_ftpport + 1;
      ip_end = strchr(ip_start, ']');
      if(ip_end) {
        addrlen = ip_end - ip_start;
        addr = ip_start;
      }
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        addr = string_ftpport;
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
          addrlen = ip_end - string_ftpport;
#ifdef USE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, &sa6->sin6_addr) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            ip_end = NULL; /* this got no port ! */
          }
#endif
        }
        else
          /* ipv4|interface */
          addrlen = strlen(string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      char *port_sep = NULL;
      char *port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;

    if(addrlen) {
      DEBUGASSERT(addr);
      if(addrlen >= sizeof(ipstr))
        goto out;
      memcpy(ipstr, addr, addrlen);
      ipstr[addrlen] = 0;

      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->remote_addr->family,
#ifdef USE_IPV6
                        Curl_ipv6_scope(&conn->remote_addr->curl_sa_addr),
                        conn->scope_id,
#endif
                        ipstr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as hostname instead */
          host = ipstr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          goto out;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for hostname */
          break;
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a hostname, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      goto out;
    }
    switch(sa->sa_family) {
#ifdef USE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r) {
      goto out;
    }
    host = hbuf; /* use this hostname */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &dns_entry);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &dns_entry);
  if(dns_entry) {
    res = dns_entry->addr;
  }
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    goto out;
  }

  host = NULL;

  /* step 2, create a socket for the requested address */
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    if(Curl_socket_open(data, ai, NULL, conn->transport, &portsock)) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), opened socket",
               FTP_DSTATE(data));

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef USE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local. Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          goto out;
        }
        port = port_min;
        possibly_non_local = FALSE; /* do not try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        goto out;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already */
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    goto out;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), socket bound to port %d",
               FTP_DSTATE(data), port);

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), listening on %d",
               FTP_DSTATE(data), port);

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef USE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  /* Replace any filter on SECONDARY with one listening on this socket */
  result = Curl_conn_tcp_listen_set(data, conn, SECONDARYSOCKET, &portsock);
  if(result)
    goto out;
  portsock = CURL_SOCKET_BAD; /* now held in filter */

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef USE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET ? 1 : 2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(*source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port >> 8), (int)(port & 0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  ftp_state(data, FTP_PORT);

out:
  /* If we looked up a dns_entry, now is the time to safely release it */
  if(dns_entry)
    Curl_resolv_unlink(data, &dns_entry);
  if(result) {
    ftp_state(data, FTP_STOP);
  }
  if(portsock != CURL_SOCKET_BAD)
    Curl_socket_close(data, conn, portsock);
  return result;
}